

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O3

void canvas_msg(_glist *gl,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_object *owner;
  _outlet *p_Var2;
  _binbuf *p_Var3;
  _clock *p_Var4;
  t_symbol *sel;
  _glist *x;
  _glist *extraout_RAX;
  _glist *extraout_RAX_00;
  _glist *p_Var5;
  _glist *x_00;
  void *data;
  t_float tVar6;
  int nobj;
  int indx;
  int ypix;
  int xpix;
  int connectme;
  int local_44;
  int local_40;
  short local_3c [2];
  short local_38 [2];
  int local_34;
  
  owner = (t_object *)pd_new(message_class);
  owner[1].te_g.g_pd = messresponder_class;
  p_Var2 = outlet_new(owner,&s_float);
  owner[1].te_g.g_next = (_gobj *)p_Var2;
  owner->te_width = 0;
  owner->field_0x2e = owner->field_0x2e & 0xfc | 2;
  p_Var3 = binbuf_new();
  owner->te_binbuf = p_Var3;
  owner[1].te_binbuf = (_binbuf *)gl;
  p_Var4 = clock_new(owner,message_tick);
  owner[1].te_outlet = (_outlet *)p_Var4;
  if (1 < argc) {
    tVar6 = atom_getfloatarg(0,argc,argv);
    owner->te_xpix = (short)(int)tVar6;
    tVar6 = atom_getfloatarg(1,argc,argv);
    owner->te_ypix = (short)(int)tVar6;
    if (argc != 2) {
      binbuf_restore(owner->te_binbuf,argc + -2,argv + 2);
    }
    glist_add(gl,(t_gobj *)owner);
    return;
  }
  iVar1 = glist_isvisible(gl);
  if (iVar1 != 0) {
    canvas_howputnew(gl,&local_34,(int *)local_38,(int *)local_3c,&local_40,&local_44);
    sel = gensym("editmode");
    pd_vmess((t_pd *)gl,sel,"i",1);
    owner->te_xpix = local_38[0];
    owner->te_ypix = local_3c[0];
    glist_add(gl,(t_gobj *)owner);
    glist_noselect(gl);
    glist_select(gl,(t_gobj *)owner);
    gobj_activate((t_gobj *)owner,gl,1);
    if (local_34 == 0) {
      p_Var5 = glist_getcanvas(x);
      canvas_startmotion(p_Var5);
      p_Var5 = extraout_RAX_00;
    }
    else {
      canvas_connect(gl,(float)local_40,0.0,(float)local_44,0.0);
      p_Var5 = extraout_RAX;
    }
    p_Var5 = glist_getcanvas(p_Var5);
    x_00 = glist_getcanvas(p_Var5);
    data = canvas_undo_set_create(x_00);
    canvas_undo_add(p_Var5,UNDO_CREATE,"create",data);
    return;
  }
  post("unable to create stub message in closed canvas!");
  return;
}

Assistant:

void canvas_msg(t_glist *gl, t_symbol *s, int argc, t_atom *argv)
{
    t_message *x = (t_message *)pd_new(message_class);
    x->m_messresponder.mr_pd = messresponder_class;
    x->m_messresponder.mr_outlet = outlet_new(&x->m_text, &s_float);
    x->m_text.te_width = 0;                             /* don't know it yet. */
    x->m_text.te_type = T_MESSAGE;
    x->m_text.te_binbuf = binbuf_new();
    x->m_glist = gl;
    x->m_clock = clock_new(x, (t_method)message_tick);
    if (argc > 1)
    {
        x->m_text.te_xpix = atom_getfloatarg(0, argc, argv);
        x->m_text.te_ypix = atom_getfloatarg(1, argc, argv);
        if (argc > 2) binbuf_restore(x->m_text.te_binbuf, argc-2, argv+2);
        glist_add(gl, &x->m_text.te_g);
    }
    else if (!glist_isvisible(gl))
        post("unable to create stub message in closed canvas!");
    else
    {
        int connectme, xpix, ypix, indx, nobj;
        canvas_howputnew(gl, &connectme, &xpix, &ypix, &indx, &nobj);

        pd_vmess(&gl->gl_pd, gensym("editmode"), "i", 1);
        x->m_text.te_xpix = xpix;
        x->m_text.te_ypix = ypix;
        glist_add(gl, &x->m_text.te_g);
        glist_noselect(gl);
        glist_select(gl, &x->m_text.te_g);
        gobj_activate(&x->m_text.te_g, gl, 1);
        if (connectme)
            canvas_connect(gl, indx, 0, nobj, 0);
        else canvas_startmotion(glist_getcanvas(gl));
        canvas_undo_add(glist_getcanvas(gl), UNDO_CREATE, "create",
            (void *)canvas_undo_set_create(glist_getcanvas(gl)));
    }
}